

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_facade.cpp
# Opt level: O2

LCC_EVENT_TYPE license::hw_identifier::HwIdentifierFacade::validate_pc_signature(string *str_code)

{
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy;
  LCC_EVENT_TYPE LVar1;
  pointer *__ptr;
  IdentificationStrategy local_38;
  HwIdentifier pc_id;
  
  HwIdentifier::HwIdentifier(&pc_id,str_code);
  strategy = HwIdentifier::get_identification_strategy(&pc_id);
  IdentificationStrategy::get_strategy(&local_38,strategy);
  LVar1 = (**(code **)(*local_38._vptr_IdentificationStrategy + 0x28))
                    (local_38._vptr_IdentificationStrategy,&pc_id);
  if (local_38._vptr_IdentificationStrategy != (_func_int **)0x0) {
    (**(code **)(*local_38._vptr_IdentificationStrategy + 8))();
  }
  HwIdentifier::~HwIdentifier(&pc_id);
  return LVar1;
}

Assistant:

LCC_EVENT_TYPE HwIdentifierFacade::validate_pc_signature(const std::string& str_code) {
	HwIdentifier pc_id(str_code);
	LCC_API_HW_IDENTIFICATION_STRATEGY id_strategy = pc_id.get_identification_strategy();
	LCC_EVENT_TYPE result = IDENTIFIERS_MISMATCH;
	try {
		unique_ptr<IdentificationStrategy> strategy = IdentificationStrategy::get_strategy(id_strategy);
		result = strategy->validate_identifier(pc_id);
	} catch (logic_error& e) {
		LOG_ERROR("Error validating identifier %s: %s", str_code.c_str(), e.what());
		((void)(e));
	}
	return result;
}